

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

char * IoTHubClientCore_LL_GetModelId(void *ctx)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  
  if (ctx != (void *)0x0) {
    pcVar1 = STRING_c_str(*(STRING_HANDLE *)((long)ctx + 0x1c8));
    return pcVar1;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_GetModelId",0x290,1,"invalid argument ctx %p",0);
  }
  return (char *)0x0;
}

Assistant:

static const char* IoTHubClientCore_LL_GetModelId(void* ctx)
{
    const char* result;
    if (ctx == NULL)
    {
        result = NULL;
        LogError("invalid argument ctx %p", ctx);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* iothub_data = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;
        result = STRING_c_str(iothub_data->model_id);
    }
    return result;
}